

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ops.cpp
# Opt level: O1

void ggml_compute_forward_argsort(ggml_compute_params *params,ggml_tensor *dst)

{
  undefined1 auVar1 [64];
  int iVar2;
  int iVar3;
  undefined4 uVar4;
  ggml_tensor *pgVar5;
  size_t sVar6;
  long lVar7;
  size_t sVar8;
  void *pvVar9;
  void *pvVar10;
  long lVar11;
  ulong uVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  int64_t i;
  long lVar16;
  void *pvVar17;
  long lVar18;
  long lVar19;
  long lVar20;
  void *pvVar21;
  undefined1 auVar22 [64];
  undefined1 auVar23 [64];
  undefined1 auVar24 [64];
  undefined1 auVar25 [64];
  undefined1 auVar26 [64];
  undefined1 auVar27 [64];
  undefined1 auVar28 [64];
  undefined1 auVar29 [64];
  undefined1 auVar30 [64];
  
  pgVar5 = dst->src[0];
  if (pgVar5->type != GGML_TYPE_F32) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml-cpu/ops.cpp"
               ,0x1ac3,"fatal error");
  }
  if (dst->nb[0] != 4) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml-cpu/ops.cpp"
               ,0x1a97,"GGML_ASSERT(%s) failed","nb0 == sizeof(float)");
  }
  sVar6 = pgVar5->nb[1];
  lVar7 = dst->ne[0];
  sVar8 = dst->nb[1];
  lVar16 = (long)params->ith;
  iVar2 = params->nth;
  lVar11 = ggml_nrows(pgVar5);
  if (lVar16 < lVar11) {
    iVar3 = dst->op_params[0];
    pvVar9 = dst->data;
    pvVar10 = pgVar5->data;
    auVar22 = vpbroadcastq_avx512f();
    pvVar17 = (void *)(sVar8 * lVar16 + (long)pvVar9);
    auVar23 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
    auVar24 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    auVar25 = vpmovsxbd_avx512f(_DAT_0014b380);
    auVar26 = vpbroadcastq_avx512f(ZEXT816(0x10));
    auVar27 = vpbroadcastd_avx512f(ZEXT416(0x10));
    do {
      if (0 < lVar7) {
        lVar18 = lVar16 * sVar8;
        lVar19 = lVar16 * sVar6;
        uVar12 = 0;
        auVar28 = vmovdqa64_avx512f(auVar24);
        auVar29 = vmovdqa64_avx512f(auVar23);
        auVar30 = vmovdqa64_avx512f(auVar25);
        do {
          vpcmpuq_avx512f(auVar28,auVar22,2);
          vpcmpuq_avx512f(auVar29,auVar22,2);
          auVar1 = vmovdqu32_avx512f(auVar30);
          *(undefined1 (*) [64])((long)pvVar17 + uVar12 * 4) = auVar1;
          uVar12 = uVar12 + 0x10;
          auVar28 = vpaddq_avx512f(auVar28,auVar26);
          auVar29 = vpaddq_avx512f(auVar29,auVar26);
          auVar30 = vpaddd_avx512f(auVar30,auVar27);
        } while ((lVar7 + 0xfU & 0xfffffffffffffff0) != uVar12);
        if (0 < lVar7) {
          lVar13 = 0;
          lVar15 = lVar7;
          pvVar21 = pvVar17;
          do {
            lVar14 = lVar13 + 1;
            if (lVar14 < lVar7) {
              lVar20 = 1;
              do {
                if (iVar3 == 1) {
                  if (*(float *)((long)pvVar10 +
                                (long)*(int *)((long)pvVar9 + lVar13 * 4 + lVar18) * 4 + lVar19) <
                      *(float *)((long)pvVar10 +
                                (long)*(int *)((long)pvVar21 + lVar20 * 4) * 4 + lVar19))
                  goto LAB_00143fa7;
                }
                else if ((iVar3 == 0) &&
                        (*(float *)((long)pvVar10 +
                                   (long)*(int *)((long)pvVar21 + lVar20 * 4) * 4 + lVar19) <
                         *(float *)((long)pvVar10 +
                                   (long)*(int *)((long)pvVar9 + lVar13 * 4 + lVar18) * 4 + lVar19))
                        ) {
LAB_00143fa7:
                  uVar4 = *(undefined4 *)((long)pvVar9 + lVar13 * 4 + lVar18);
                  *(undefined4 *)((long)pvVar9 + lVar13 * 4 + lVar18) =
                       *(undefined4 *)((long)pvVar21 + lVar20 * 4);
                  *(undefined4 *)((long)pvVar21 + lVar20 * 4) = uVar4;
                }
                lVar20 = lVar20 + 1;
              } while (lVar15 != lVar20);
            }
            pvVar21 = (void *)((long)pvVar21 + 4);
            lVar15 = lVar15 + -1;
            lVar13 = lVar14;
          } while (lVar14 != lVar7);
        }
      }
      lVar16 = lVar16 + iVar2;
      pvVar17 = (void *)((long)pvVar17 + sVar8 * (long)iVar2);
    } while (lVar16 < lVar11);
  }
  return;
}

Assistant:

void ggml_compute_forward_argsort(
    const ggml_compute_params * params,
    ggml_tensor * dst) {

    const ggml_tensor * src0 = dst->src[0];

    switch (src0->type) {
        case GGML_TYPE_F32:
            {
                ggml_compute_forward_argsort_f32(params, dst);
            } break;
        default:
            {
                GGML_ABORT("fatal error");
            }
    }
}